

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# options.c
# Opt level: O0

int nni_copyin_ms(nni_duration *dp,void *v,size_t sz,nni_type t)

{
  nni_duration dur;
  nni_type t_local;
  size_t sz_local;
  void *v_local;
  nni_duration *dp_local;
  
  if (t == NNI_TYPE_DURATION) {
    if (*v < -1) {
      dp_local._4_4_ = 3;
    }
    else {
      if (dp != (nni_duration *)0x0) {
        *dp = *v;
      }
      dp_local._4_4_ = 0;
    }
  }
  else {
    dp_local._4_4_ = 0x1e;
  }
  return dp_local._4_4_;
}

Assistant:

int
nni_copyin_ms(nni_duration *dp, const void *v, size_t sz, nni_type t)
{
	nni_duration dur;
	NNI_ARG_UNUSED(sz);

	if (t != NNI_TYPE_DURATION) {
		return (NNG_EBADTYPE);
	}
	dur = *(nng_duration *) v;

	if (dur < -1) {
		return (NNG_EINVAL);
	}
	if (dp != NULL) {
		*dp = dur;
	}
	return (0);
}